

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O2

bool hashSearch<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  size_t n;
  long lVar8;
  long lVar9;
  string *psVar10;
  size_t i;
  size_type __n;
  pointer key;
  size_type sVar11;
  reference rVar12;
  string upper_name;
  vector<int,_std::allocator<int>_> mapping;
  array<unsigned_int,_6UL> best_c;
  vector<bool,_std::allocator<bool>_> hash_table;
  byte local_191;
  uint local_190;
  string local_180;
  string *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_158;
  size_type local_150;
  string *local_148;
  _Vector_base<int,_std::allocator<int>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_158 = vals;
  local_148 = default_value;
  if ((ulong)((long)(keys->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar2 = hasDuplicates<std::__cxx11::string>(keys);
  if (bVar2) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x85,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  lVar8 = (long)(local_158->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_158->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_160 = map_name;
  if (lVar8 != (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x86,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  n = getModulusBitmask(((ulong)expansion * (lVar8 >> 5)) / (ulong)reduction);
  local_150 = n + 1;
  local_180._M_dataplus._M_p._0_4_ = (uint)local_180._M_dataplus._M_p & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,local_150,(bool *)&local_180,
             (allocator_type *)&local_128);
  local_191 = 7;
  uVar6 = c_min._M_elems[0];
  do {
    c._M_elems[0] = uVar6;
    local_190 = (uint)n;
    uVar4 = c_min._M_elems[1];
    if (c_max._M_elems[0] < uVar6) {
      if (local_191 != 7) {
        c._M_elems[4] = local_f8[0];
        c._M_elems[5] = local_f8[1];
        c._M_elems[0] = local_108[0];
        c._M_elems[1] = local_108[1];
        c._M_elems[2] = auStack_100[0];
        c._M_elems[3] = auStack_100[1];
        local_180._M_dataplus._M_p._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_140,local_150,
                   (value_type_conflict4 *)&local_180,(allocator_type *)&local_128);
        key = (keys->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
        lVar8 = (long)key -
                (long)(keys->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
        while( true ) {
          key = key + -1;
          bVar2 = lVar8 == 0;
          lVar8 = lVar8 + -1;
          if (bVar2) break;
          uVar5 = hash(key);
          local_140._M_impl.super__Vector_impl_data._M_start[uVar5 & local_190] = (int)lVar8;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_f0,local_158);
        std::__cxx11::string::string((string *)&local_78,(string *)local_160);
        getCommonCodeGen<std::__cxx11::string>
                  (&local_180,keys,&local_f0,(vector<int,_std::allocator<int>_> *)&local_140,n,
                   &local_78,nonKeyLookups);
        std::__cxx11::string::operator=((string *)hash_str,(string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f0);
        psVar1 = local_160;
        psVar10 = local_160;
        std::__cxx11::string::string((string *)&local_98,(string *)local_160);
        typeStr(&local_b8,psVar10);
        hashStr(&local_180,psVar10,n,local_148,&local_98,&local_b8,nonKeyLookups);
        std::__cxx11::string::append((string *)hash_str);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::string((string *)&local_180,(string *)psVar1);
        lVar8 = CONCAT44(local_180._M_dataplus._M_p._4_4_,(uint)local_180._M_dataplus._M_p);
        for (sVar11 = 0; local_180._M_string_length != sVar11; sVar11 = sVar11 + 1) {
          iVar7 = toupper((int)*(char *)(lVar8 + sVar11));
          *(char *)(lVar8 + sVar11) = (char)iVar7;
        }
        std::operator+(&local_d8,"#endif // POIFECT_",&local_180);
        std::operator+(&local_128,&local_d8,"_H\n");
        std::__cxx11::string::append((string *)hash_str);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_180);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_140);
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
      return local_191 != 7;
    }
    while( true ) {
      c._M_elems[1] = uVar4;
      uVar6 = c_min._M_elems[2];
      if (c_max._M_elems[1] < uVar4) break;
      while( true ) {
        c._M_elems[2] = uVar6;
        uVar4 = c_min._M_elems[3];
        if (c_max._M_elems[2] < uVar6) break;
        while( true ) {
          c._M_elems[3] = uVar4;
          uVar6 = c_min._M_elems[4];
          if (c_max._M_elems[3] < uVar4) break;
          while( true ) {
            c._M_elems[4] = uVar6;
            uVar4 = c_min._M_elems[5];
            if (c_max._M_elems[4] < uVar6) break;
            while( true ) {
              c._M_elems[5] = uVar4;
              if (c_max._M_elems[5] < uVar4) break;
              bVar3 = checkNonzeroCoeffs();
              __n = n;
              if (bVar3 < local_191) {
                for (; __n != 0xffffffffffffffff; __n = __n - 1) {
                  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
                  *rVar12._M_p = *rVar12._M_p & ~rVar12._M_mask;
                }
                lVar8 = (long)(keys->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(keys->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                lVar9 = lVar8 >> 5;
                while( true ) {
                  bVar2 = lVar9 == 0;
                  lVar9 = lVar9 + -1;
                  if (bVar2) break;
                  uVar5 = hash((string *)
                               ((long)&(keys->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                       _M_p + lVar8));
                  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&local_58,
                                      (ulong)(uVar5 & local_190));
                  if ((*rVar12._M_p & rVar12._M_mask) != 0) goto LAB_001089ad;
                  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&local_58,
                                      (ulong)(uVar5 & local_190));
                  *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
                  lVar8 = lVar8 + -0x20;
                }
                local_f8[0] = c._M_elems[4];
                local_f8[1] = c._M_elems[5];
                local_108[0] = c._M_elems[0];
                local_108[1] = c._M_elems[1];
                auStack_100[0] = c._M_elems[2];
                auStack_100[1] = c._M_elems[3];
                local_191 = bVar3;
              }
LAB_001089ad:
              uVar4 = c._M_elems[5] + 1;
            }
            uVar6 = c._M_elems[4] + 1;
          }
          uVar4 = c._M_elems[3] + 1;
        }
        uVar6 = c._M_elems[2] + 1;
      }
      uVar4 = c._M_elems[1] + 1;
    }
    uVar6 = c._M_elems[0] + 1;
  } while( true );
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}